

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * CLI::detail::extract_binary_string(string *escaped_string)

{
  int iVar1;
  size_type sVar2;
  const_reference pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  uint32_t res2;
  uint32_t res1;
  value_type c2;
  value_type c1;
  size_t loc;
  size_t ssize;
  size_t tail;
  size_t start;
  string *outstring;
  size_type in_stack_ffffffffffffff88;
  uint32_t in_stack_ffffffffffffff90;
  uint32_t in_stack_ffffffffffffff94;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  uint32_t uVar4;
  undefined2 in_stack_ffffffffffffffb4;
  undefined1 in_stack_ffffffffffffffb6;
  value_type hc;
  undefined1 in_stack_ffffffffffffffb7;
  value_type hc_00;
  size_type in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  long local_20;
  ulong local_18;
  
  local_18 = 0;
  local_20 = 0;
  this = in_RDI;
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (in_RSI);
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                     CONCAT17(in_stack_ffffffffffffffb7,
                              CONCAT16(in_stack_ffffffffffffffb6,
                                       CONCAT24(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                                      )),
                     (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  if ((iVar1 == 0) &&
     (iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                      CONCAT17(in_stack_ffffffffffffffb7,
                               CONCAT16(in_stack_ffffffffffffffb6,
                                        CONCAT24(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0
                                                ))),
                      (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)),
     iVar1 == 0)) {
    local_18 = 3;
    local_20 = 2;
  }
  else {
    iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                       CONCAT17(in_stack_ffffffffffffffb7,
                                CONCAT16(in_stack_ffffffffffffffb6,
                                         CONCAT24(in_stack_ffffffffffffffb4,
                                                  in_stack_ffffffffffffffb0))),
                       (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if ((iVar1 == 0) &&
       (iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                        CONCAT17(in_stack_ffffffffffffffb7,
                                 CONCAT16(in_stack_ffffffffffffffb6,
                                          CONCAT24(in_stack_ffffffffffffffb4,
                                                   in_stack_ffffffffffffffb0))),
                        (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)),
       iVar1 == 0)) {
      local_18 = 4;
      local_20 = 3;
    }
  }
  if (local_18 == 0) {
    ::std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8);
    return this;
  }
  ::std::__cxx11::string::string(this);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffffb7,
                      CONCAT16(in_stack_ffffffffffffffb6,
                               CONCAT24(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0))),
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  do {
    while( true ) {
      if (sVar2 - local_20 <= local_18) {
        return this;
      }
      pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                          in_stack_ffffffffffffff88);
      if ((*pvVar3 == '\\') &&
         ((pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                 in_stack_ffffffffffffff88), *pvVar3 == 'x' ||
          (pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                 in_stack_ffffffffffffff88), *pvVar3 == 'X')))) break;
LAB_00197498:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff88);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (this,(char)((ulong)in_RDI >> 0x38));
      local_18 = local_18 + 1;
    }
    pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                        in_stack_ffffffffffffff88);
    hc_00 = *pvVar3;
    pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                        in_stack_ffffffffffffff88);
    hc = *pvVar3;
    in_stack_ffffffffffffff94 = hexConvert(hc_00);
    uVar4 = in_stack_ffffffffffffff94;
    in_stack_ffffffffffffff90 = hexConvert(hc);
    if ((0xf < uVar4) || (0xf < in_stack_ffffffffffffff90)) goto LAB_00197498;
    local_18 = local_18 + 4;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (this,(char)((ulong)in_RDI >> 0x38));
  } while( true );
}

Assistant:

CLI11_INLINE std::string extract_binary_string(const std::string &escaped_string) {
    std::size_t start{0};
    std::size_t tail{0};
    size_t ssize = escaped_string.size();
    if(escaped_string.compare(0, 3, "B\"(") == 0 && escaped_string.compare(ssize - 2, 2, ")\"") == 0) {
        start = 3;
        tail = 2;
    } else if(escaped_string.compare(0, 4, "'B\"(") == 0 && escaped_string.compare(ssize - 3, 3, ")\"'") == 0) {
        start = 4;
        tail = 3;
    }

    if(start == 0) {
        return escaped_string;
    }
    std::string outstring;

    outstring.reserve(ssize - start - tail);
    std::size_t loc = start;
    while(loc < ssize - tail) {
        // ssize-2 to skip )" at the end
        if(escaped_string[loc] == '\\' && (escaped_string[loc + 1] == 'x' || escaped_string[loc + 1] == 'X')) {
            auto c1 = escaped_string[loc + 2];
            auto c2 = escaped_string[loc + 3];

            std::uint32_t res1 = hexConvert(c1);
            std::uint32_t res2 = hexConvert(c2);
            if(res1 <= 0x0F && res2 <= 0x0F) {
                loc += 4;
                outstring.push_back(static_cast<char>(res1 * 16 + res2));
                continue;
            }
        }
        outstring.push_back(escaped_string[loc]);
        ++loc;
    }
    return outstring;
}